

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O1

QStringList * __thiscall
QLocale::uiLanguages(QStringList *__return_storage_ptr__,QLocale *this,TagSeparator separator)

{
  undefined2 uVar1;
  undefined2 uVar4;
  undefined4 uVar2;
  undefined4 uVar3;
  QLocaleData *pQVar5;
  Data *pDVar6;
  QArrayDataPointer<QString> *data;
  QString *pQVar7;
  QLocaleId *pQVar8;
  QLocaleData *pQVar9;
  long *plVar10;
  storage_type_conflict *psVar11;
  ushort uVar12;
  ushort uVar13;
  undefined8 uVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  QChar ch;
  uint uVar18;
  QLocaleId QVar19;
  QLocaleId QVar20;
  storage_type_conflict *psVar21;
  const_iterator cVar22;
  QtPrivate *this_00;
  long *plVar23;
  QString *pQVar24;
  QSystemLocale *pQVar25;
  storage_type_conflict *psVar26;
  storage_type *psVar27;
  storage_type_conflict *extraout_RDX;
  storage_type_conflict *psVar28;
  storage_type_conflict *extraout_RDX_00;
  storage_type_conflict *extraout_RDX_03;
  storage_type_conflict *extraout_RDX_04;
  storage_type_conflict *extraout_RDX_05;
  storage_type_conflict *extraout_RDX_06;
  storage_type_conflict *extraout_RDX_07;
  storage_type_conflict *extraout_RDX_08;
  storage_type_conflict *extraout_RDX_09;
  storage_type_conflict *extraout_RDX_10;
  storage_type_conflict *extraout_RDX_11;
  storage_type_conflict *extraout_RDX_13;
  storage_type_conflict *extraout_RDX_14;
  storage_type_conflict *extraout_RDX_15;
  storage_type_conflict *extraout_RDX_16;
  storage_type_conflict *extraout_RDX_17;
  storage_type_conflict *extraout_RDX_18;
  storage_type_conflict *extraout_RDX_19;
  storage_type_conflict *extraout_RDX_20;
  storage_type_conflict *extraout_RDX_21;
  __hashtable *__h;
  ushort uVar29;
  long lVar30;
  qsizetype qVar31;
  undefined8 uVar32;
  _func_int **in_R8;
  undefined8 in_R9;
  ushort uVar33;
  const_iterator __it;
  long lVar34;
  storage_type_conflict *psVar35;
  const_iterator cVar36;
  long in_FS_OFFSET;
  bool bVar37;
  QStringView name;
  QStringView name_00;
  QStringView name_01;
  QStringView haystack;
  QStringView haystack_00;
  QStringView name_02;
  QStringView before;
  QStringView name_03;
  QStringView str;
  QLatin1StringView str_00;
  QByteArrayView ba;
  QLatin1StringView rhs;
  QStringView needle;
  QStringView needle_00;
  QStringView rhs_00;
  QStringView needle_01;
  QByteArrayView ba_00;
  QStringView str_01;
  QByteArrayView ba_01;
  QStringView lhs;
  QStringView haystack_01;
  QStringView haystack_02;
  QStringView lhs_00;
  QLatin1StringView haystack_03;
  QStringView after;
  pair<std::__detail::_Node_iterator<QString,_true,_true>,_bool> pVar38;
  add_const_t<QList<QString>_> *__range2;
  QLocaleId id;
  QDuplicateTracker<QString,_32UL> known;
  QArrayDataPointer<QString> *local_7d0;
  storage_type_conflict *local_7b0;
  QArrayDataPointer<QString> *local_7a8;
  long local_798;
  long local_788;
  QLocaleId local_758;
  QLocaleId local_750;
  QArrayDataPointer<QString> local_748;
  QList<QLocaleId> local_728;
  QArrayDataPointer<QString> local_708;
  undefined1 local_6e8 [22];
  TagSeparator TStack_6d2;
  undefined1 uStack_6d1;
  QArrayDataPointer<QString> *pQStack_6d0;
  QString *local_6c8;
  QLocaleId *pQStack_6c0;
  bool local_6b8;
  undefined7 uStack_6b7;
  monotonic_buffer_resource local_e8 [64];
  undefined1 local_a8 [80];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 local_40;
  long local_38;
  storage_type_conflict *extraout_RDX_01;
  storage_type_conflict *extraout_RDX_02;
  storage_type_conflict *extraout_RDX_12;
  
  uVar32 = local_6e8._0_8_;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QString *)0x0;
  (__return_storage_ptr__->d).size = 0;
  if ((char)separator < '\0') {
    badSeparatorWarning("uiLanguages",separator);
    goto LAB_0031bb81;
  }
  local_728.d.d = (Data *)0x0;
  local_728.d.ptr = (QLocaleId *)0x0;
  local_728.d.size = 0;
  pQVar5 = ((this->d).d.ptr)->m_data;
  if (pQVar5 == &systemLocaleData) {
    pQVar25 = systemLocale();
    local_58 = (QArrayDataPointer<QString> *)0x0;
    uStack_50 = (QString *)0x0;
    local_48 = (QLocaleId *)0x0;
    local_40 = 2;
    in_R8 = pQVar25->_vptr_QSystemLocale;
    (*in_R8[2])(local_6e8,pQVar25,0x22);
    ::QVariant::toStringList((QStringList *)&local_748,(QVariant *)local_6e8);
    qVar31 = local_748.size;
    pQVar24 = local_748.ptr;
    pDVar6 = local_748.d;
    local_748.d = (Data *)0x0;
    local_748.ptr = (QString *)0x0;
    local_748.size = 0;
    local_708.d = (__return_storage_ptr__->d).d;
    local_708.ptr = (__return_storage_ptr__->d).ptr;
    (__return_storage_ptr__->d).d = pDVar6;
    (__return_storage_ptr__->d).ptr = pQVar24;
    local_708.size = (__return_storage_ptr__->d).size;
    (__return_storage_ptr__->d).size = qVar31;
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_708);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_748);
    ::QVariant::~QVariant((QVariant *)local_6e8);
    ::QVariant::~QVariant((QVariant *)&local_58);
    uVar32 = local_6e8._0_8_;
    psVar28 = extraout_RDX_19;
    if (separator != Dash) {
      in_R8 = (_func_int **)local_6e8;
      local_6e8[1] = 0;
      local_6e8[0] = separator;
      local_6e8._2_6_ = SUB86(uVar32,2);
      in_R9 = 1;
      before.m_data = L"-";
      before.m_size = 1;
      after.m_data = (storage_type_conflict *)in_R8;
      after.m_size = 1;
      QtPrivate::QStringList_replaceInStrings(__return_storage_ptr__,before,after,CaseSensitive);
      QArrayDataPointer<QString>::operator=(&__return_storage_ptr__->d,&__return_storage_ptr__->d);
      psVar28 = extraout_RDX_20;
    }
    lVar34 = (__return_storage_ptr__->d).size;
    if (lVar34 != 0) {
      pQVar24 = (__return_storage_ptr__->d).ptr;
      lVar30 = 0;
      do {
        name_03.m_data = psVar28;
        name_03.m_size = *(qsizetype *)((long)&(pQVar24->d).ptr + lVar30);
        QVar19 = QLocaleId::fromName(*(QLocaleId **)((long)&(pQVar24->d).size + lVar30),name_03);
        local_6e8._0_6_ = QVar19;
        QtPrivate::QPodArrayOps<QLocaleId>::emplace<QLocaleId>
                  ((QPodArrayOps<QLocaleId> *)&local_728,local_728.d.size,(QLocaleId *)local_6e8);
        QList<QLocaleId>::end(&local_728);
        lVar30 = lVar30 + 0x18;
        psVar28 = extraout_RDX_21;
      } while (lVar34 * 0x18 != lVar30);
    }
    if ((QArrayDataPointer<QString> *)local_728.d.size == (QArrayDataPointer<QString> *)0x0) {
      pQVar25 = systemLocale();
      (*pQVar25->_vptr_QSystemLocale[3])(local_6e8,pQVar25);
      if (((QArrayDataPointer<QString> *)local_6e8._0_8_ != (QArrayDataPointer<QString> *)0x0) &&
         ((((PrivateShared *)(local_6e8._0_8_ + 8))->ref).super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i != 1)) {
        QSharedDataPointer<QLocalePrivate>::detach_helper
                  ((QSharedDataPointer<QLocalePrivate> *)local_6e8);
      }
      local_58._4_2_ = *(undefined2 *)((long)*(PrivateShared *)local_6e8._0_8_ + 4);
      local_58._0_4_ = *(undefined4 *)*(PrivateShared *)local_6e8._0_8_;
      QtPrivate::QPodArrayOps<QLocaleId>::emplace<QLocaleId>
                ((QPodArrayOps<QLocaleId> *)&local_728,local_728.d.size,(QLocaleId *)&local_58);
      QList<QLocaleId>::end(&local_728);
      ~QLocale((QLocale *)local_6e8);
    }
    stack0xfffffffffffff928 = &DAT_aaaaaaaaaaaaaaaa;
    local_6e8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_6e8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    pQVar9 = ((this->d).d.ptr)->m_data;
    psVar27 = (storage_type *)(ulong)pQVar9->m_territory_id;
    uVar2._0_2_ = pQVar9->m_language_id;
    uVar2._2_2_ = pQVar9->m_script_id;
    local_708.d = (Data *)CONCAT44(CONCAT22(local_708.d._6_2_,pQVar9->m_territory_id),uVar2);
    QLocaleId::name((QByteArray *)&local_58,(QLocaleId *)&local_708,separator);
    ba_00.m_data = psVar27;
    ba_00.m_size = uStack_50;
    QString::fromLatin1((QString *)local_6e8,(QString *)local_48,ba_00);
    if ((QArrayDataPointer<QString> *)local_58 != (QArrayDataPointer<QString> *)0x0) {
      LOCK();
      (((PrivateShared *)local_58)->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int>._M_i =
           (((PrivateShared *)local_58)->ref).super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((PrivateShared *)local_58)->ref).super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_58,1,0x10);
      }
    }
    if ((((QStringList *)stack0xfffffffffffff928 != (QStringList *)0x0) &&
        (((this->d).d.ptr)->m_data->m_language_id != 1)) &&
       (str_01.m_data = (storage_type_conflict *)0x1, str_01.m_size = local_6e8._8_8_,
       bVar15 = QtPrivate::QStringList_contains
                          ((QtPrivate *)__return_storage_ptr__,
                           (QStringList *)stack0xfffffffffffff928,str_01,(CaseSensitivity)in_R8),
       !bVar15)) {
      pQVar9 = ((this->d).d.ptr)->m_data;
      uVar3._0_2_ = pQVar9->m_language_id;
      uVar3._2_2_ = pQVar9->m_script_id;
      local_748.d = (Data *)CONCAT44(CONCAT22((short)((ulong)local_748.d >> 0x30),
                                              pQVar9->m_territory_id),uVar3);
      QVar19 = QLocaleId::withLikelySubtagsRemoved((QLocaleId *)&local_748);
      __it.i = (__return_storage_ptr__->d).ptr;
      lVar34 = (__return_storage_ptr__->d).size;
      psVar27 = (storage_type *)(lVar34 * 3);
      pQVar24 = __it.i + lVar34;
      local_58._0_6_ = QVar19;
      if (0 < lVar34 >> 2) {
        lVar34 = (lVar34 >> 2) + 1;
        do {
          bVar15 = __gnu_cxx::__ops::
                   _Iter_pred<QLocale::uiLanguages(QLocale::TagSeparator)const::$_1>::operator()
                             ((_Iter_pred<QLocale::uiLanguages(QLocale::TagSeparator)const::__1> *)
                              ((anon_union_24_3_e3d07ef4_for_data *)&local_58)->data,__it);
          cVar36.i = __it.i;
          if (bVar15) goto LAB_0031bfdf;
          bVar15 = __gnu_cxx::__ops::
                   _Iter_pred<QLocale::uiLanguages(QLocale::TagSeparator)const::$_1>::operator()
                             ((_Iter_pred<QLocale::uiLanguages(QLocale::TagSeparator)const::__1> *)
                              ((anon_union_24_3_e3d07ef4_for_data *)&local_58)->data,__it.i + 1);
          cVar36.i = __it.i + 1;
          if (bVar15) goto LAB_0031bfdf;
          bVar15 = __gnu_cxx::__ops::
                   _Iter_pred<QLocale::uiLanguages(QLocale::TagSeparator)const::$_1>::operator()
                             ((_Iter_pred<QLocale::uiLanguages(QLocale::TagSeparator)const::__1> *)
                              ((anon_union_24_3_e3d07ef4_for_data *)&local_58)->data,__it.i + 2);
          cVar36.i = __it.i + 2;
          if (bVar15) goto LAB_0031bfdf;
          bVar15 = __gnu_cxx::__ops::
                   _Iter_pred<QLocale::uiLanguages(QLocale::TagSeparator)const::$_1>::operator()
                             ((_Iter_pred<QLocale::uiLanguages(QLocale::TagSeparator)const::__1> *)
                              ((anon_union_24_3_e3d07ef4_for_data *)&local_58)->data,__it.i + 3);
          cVar36.i = __it.i + 3;
          if (bVar15) goto LAB_0031bfdf;
          __it.i = __it.i + 4;
          lVar34 = lVar34 + -1;
        } while (1 < lVar34);
      }
      psVar27 = (storage_type *)((long)pQVar24 - (long)__it.i >> 3);
      lVar34 = (long)psVar27 * -0x5555555555555555;
      if (lVar34 == 1) {
LAB_0031bfc6:
        bVar15 = __gnu_cxx::__ops::_Iter_pred<QLocale::uiLanguages(QLocale::TagSeparator)const::$_1>
                 ::operator()((_Iter_pred<QLocale::uiLanguages(QLocale::TagSeparator)const::__1> *)
                              ((anon_union_24_3_e3d07ef4_for_data *)&local_58)->data,__it);
        cVar36.i = __it.i;
        if (!bVar15) {
          cVar36.i = pQVar24;
        }
      }
      else if (lVar34 == 2) {
LAB_0031bfae:
        bVar15 = __gnu_cxx::__ops::_Iter_pred<QLocale::uiLanguages(QLocale::TagSeparator)const::$_1>
                 ::operator()((_Iter_pred<QLocale::uiLanguages(QLocale::TagSeparator)const::__1> *)
                              ((anon_union_24_3_e3d07ef4_for_data *)&local_58)->data,__it);
        cVar36.i = __it.i;
        if (!bVar15) {
          __it.i = __it.i + 1;
          goto LAB_0031bfc6;
        }
      }
      else {
        cVar36.i = pQVar24;
        if ((lVar34 == 3) &&
           (bVar15 = __gnu_cxx::__ops::
                     _Iter_pred<QLocale::uiLanguages(QLocale::TagSeparator)const::$_1>::operator()
                               ((_Iter_pred<QLocale::uiLanguages(QLocale::TagSeparator)const::__1> *
                                )((anon_union_24_3_e3d07ef4_for_data *)&local_58)->data,__it),
           cVar36.i = __it.i, !bVar15)) {
          __it.i = __it.i + 1;
          goto LAB_0031bfae;
        }
      }
LAB_0031bfdf:
      if (cVar36.i == pQVar24) {
        QtPrivate::QPodArrayOps<QLocaleId>::emplace<QLocaleId_const&>
                  ((QPodArrayOps<QLocaleId> *)&local_728,0,(QLocaleId *)&local_748);
        QLocaleId::name((QByteArray *)&local_708,(QLocaleId *)&local_748,separator);
        ba_01.m_data = psVar27;
        ba_01.m_size = (qsizetype)local_708.ptr;
        QString::fromLatin1((QString *)&local_58,(QString *)local_708.size,ba_01);
        QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                  ((QMovableArrayOps<QString> *)__return_storage_ptr__,0,(QString *)&local_58);
        if ((QArrayDataPointer<QString> *)local_58 != (QArrayDataPointer<QString> *)0x0) {
          LOCK();
          (((PrivateShared *)local_58)->ref).super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
               (((PrivateShared *)local_58)->ref).super_QAtomicInteger<int>.
               super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((PrivateShared *)local_58)->ref).super_QAtomicInteger<int>.
              super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_58,2,0x10);
          }
        }
        if ((QArrayDataPointer<QString> *)local_708.d != (QArrayDataPointer<QString> *)0x0) {
          LOCK();
          *(int *)&(local_708.d)->super_QArrayData = *(int *)&(local_708.d)->super_QArrayData + -1;
          UNLOCK();
          if (*(int *)&(local_708.d)->super_QArrayData == 0) {
            QArrayData::deallocate(&(local_708.d)->super_QArrayData,1,0x10);
          }
        }
      }
    }
    if ((QArrayDataPointer<QString> *)local_6e8._0_8_ != (QArrayDataPointer<QString> *)0x0) {
      LOCK();
      (((QAtomicInt *)local_6e8._0_8_)->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int>._M_i =
           (((QAtomicInt *)local_6e8._0_8_)->super_QAtomicInteger<int>).
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QAtomicInt *)local_6e8._0_8_)->super_QAtomicInteger<int>).
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_6e8._0_8_,2,0x10);
      }
    }
  }
  else {
    uVar1 = pQVar5->m_language_id;
    uVar4 = pQVar5->m_script_id;
    local_6e8._2_2_ = uVar4;
    local_6e8._0_2_ = uVar1;
    local_6e8._6_2_ = SUB82(uVar32,6);
    local_6e8._4_2_ = pQVar5->m_territory_id;
    QtPrivate::QPodArrayOps<QLocaleId>::emplace<QLocaleId>
              ((QPodArrayOps<QLocaleId> *)&local_728,0,(QLocaleId *)local_6e8);
    QList<QLocaleId>::end(&local_728);
  }
  local_7d0 = (QArrayDataPointer<QString> *)local_728.d.size;
  if ((QArrayDataPointer<QString> *)local_728.d.size != (QArrayDataPointer<QString> *)0x0) {
    lVar34 = local_728.d.size * 6;
    do {
      uVar2 = *(undefined4 *)((long)&local_728.d.ptr[-1].language_id + lVar34);
      local_748.d = (Data *)CONCAT44(CONCAT22((short)((ulong)local_748.d >> 0x30),
                                              *(undefined2 *)((long)local_728.d.ptr + lVar34 + -2)),
                                     uVar2);
      if ((short)uVar2 == 1) {
        str.m_data = (storage_type_conflict *)0x1;
        str.m_size = (qsizetype)L"C";
        bVar15 = QtPrivate::QStringList_contains
                           ((QtPrivate *)__return_storage_ptr__,(QStringList *)0x1,str,
                            (CaseSensitivity)in_R8);
        if (!bVar15) {
          local_6e8._0_8_ = (QArrayDataPointer<QString> *)0x0;
          local_6e8._8_8_ = L"C";
          stack0xfffffffffffff928 = (QStringList *)0x1;
          QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                    ((QMovableArrayOps<QString> *)__return_storage_ptr__,
                     (__return_storage_ptr__->d).size,(QString *)local_6e8);
          QList<QString>::end(__return_storage_ptr__);
          if ((QArrayDataPointer<QString> *)local_6e8._0_8_ != (QArrayDataPointer<QString> *)0x0) {
            LOCK();
            (((QAtomicInt *)local_6e8._0_8_)->super_QAtomicInteger<int>).
            super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
                 (((QAtomicInt *)local_6e8._0_8_)->super_QAtomicInteger<int>).
                 super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QAtomicInt *)local_6e8._0_8_)->super_QAtomicInteger<int>).
                super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
              qVar31 = 2;
              uVar32 = local_6e8._0_8_;
              goto LAB_0031b268;
            }
          }
        }
      }
      else {
        local_708.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_48 = &DAT_aaaaaaaaaaaaaaaa;
        local_58 = &DAT_aaaaaaaaaaaaaaaa;
        uStack_50 = &DAT_aaaaaaaaaaaaaaaa;
        QLocaleId::name((QByteArray *)&local_58,(QLocaleId *)&local_748,separator);
        if ((pQVar5 == &systemLocaleData) && ((long)local_7d0 <= (__return_storage_ptr__->d).size))
        {
          pQVar24 = (__return_storage_ptr__->d).ptr;
          pQVar8 = *(QLocaleId **)((long)pQVar24 + lVar34 * 4 + -8);
          if (pQVar8 == (QLocaleId *)local_48) {
            rhs.m_data = (char *)uStack_50;
            rhs.m_size = local_48;
            lhs.m_data = *(storage_type_conflict **)((long)pQVar24 + lVar34 * 4 + -0x10);
            lhs.m_size = (qsizetype)pQVar8;
            bVar15 = QtPrivate::equalStrings(lhs,rhs);
            local_708.d = (Data *)local_7d0;
          }
          else {
            bVar15 = false;
            local_708.d = (Data *)local_7d0;
          }
        }
        else {
          str_00.m_data = (char *)0x1;
          str_00.m_size = uStack_50;
          psVar27 = (storage_type *)0x1;
          bVar15 = QtPrivate::QStringList_contains
                             ((QtPrivate *)__return_storage_ptr__,(QStringList *)local_48,str_00,
                              (CaseSensitivity)in_R8);
          if (!bVar15) {
            ba.m_data = psVar27;
            ba.m_size = uStack_50;
            QString::fromLatin1((QString *)local_6e8,(QString *)local_48,ba);
            QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                      ((QMovableArrayOps<QString> *)__return_storage_ptr__,
                       (__return_storage_ptr__->d).size,(QString *)local_6e8);
            QList<QString>::end(__return_storage_ptr__);
            uVar32 = local_6e8._0_8_;
            if ((QArrayDataPointer<QString> *)local_6e8._0_8_ != (QArrayDataPointer<QString> *)0x0)
            {
              LOCK();
              (((QAtomicInt *)local_6e8._0_8_)->super_QAtomicInteger<int>).
              super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
                   (((QAtomicInt *)local_6e8._0_8_)->super_QAtomicInteger<int>).
                   super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((((QAtomicInt *)uVar32)->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>
                  ._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate((QArrayData *)local_6e8._0_8_,2,0x10);
              }
            }
          }
          bVar15 = true;
          local_708.d = (Data *)(__return_storage_ptr__->d).size;
        }
        QVar19 = QLocaleId::withLikelySubtagsAdded((QLocaleId *)&local_748);
        local_6e8._0_8_ = &local_708;
        uVar29 = QVar19.script_id;
        uVar33 = QVar19.territory_id;
        TStack_6d2 = separator;
        local_6e8._16_6_ = QVar19;
        uStack_6d1 = 0xaa;
        pQStack_6d0 = (QArrayDataPointer<QString> *)local_58;
        local_6c8 = (QString *)uStack_50;
        pQStack_6c0 = (QLocaleId *)local_48;
        if ((QArrayDataPointer<QString> *)local_58 != (QArrayDataPointer<QString> *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)&((PrivateShared *)local_58)->ref)->_q_value).
          super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)&((PrivateShared *)local_58)->ref)->_q_value).
               super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        uStack_6b7 = 0xaaaaaaaaaaaaaa;
        local_6b8 = bVar15;
        local_6e8._8_8_ = __return_storage_ptr__;
        uiLanguages::anon_class_56_6_d83b7451::operator()
                  ((anon_class_56_6_d83b7451 *)local_6e8,(QLocaleId)((uint6)QVar19 & 0xffff));
        if (uVar29 != 0) {
          uiLanguages::anon_class_56_6_d83b7451::operator()
                    ((anon_class_56_6_d83b7451 *)local_6e8,(QLocaleId)((uint6)QVar19 & 0xffffffff));
        }
        uVar12 = local_748.d._2_2_;
        if (local_748.d._2_2_ != uVar29 && local_748.d._2_2_ != 0) {
          QVar20.territory_id = 0;
          QVar20.language_id = (short)(uint)local_748.d;
          QVar20.script_id = (short)((uint)local_748.d >> 0x10);
          uiLanguages::anon_class_56_6_d83b7451::operator()
                    ((anon_class_56_6_d83b7451 *)local_6e8,QVar20);
        }
        if (uVar33 != 0) {
          uiLanguages::anon_class_56_6_d83b7451::operator()
                    ((anon_class_56_6_d83b7451 *)local_6e8,
                     (QLocaleId)((uint6)QVar19 & 0xffff0000ffff));
        }
        uVar13 = local_748.d._4_2_;
        if (local_748.d._4_2_ != uVar33 && local_748.d._4_2_ != 0) {
          uiLanguages::anon_class_56_6_d83b7451::operator()
                    ((anon_class_56_6_d83b7451 *)local_6e8,
                     (QLocaleId)((uint6)local_748.d._4_2_ << 0x20 | (uint6)(ushort)local_748.d));
        }
        if (uVar29 != 0 && uVar33 != 0) {
          uiLanguages::anon_class_56_6_d83b7451::operator()
                    ((anon_class_56_6_d83b7451 *)local_6e8,QVar19);
        }
        if ((uVar12 != 0 && uVar33 != 0) && uVar12 != uVar29) {
          uiLanguages::anon_class_56_6_d83b7451::operator()
                    ((anon_class_56_6_d83b7451 *)local_6e8,
                     (QLocaleId)
                     ((uint6)uVar12 << 0x10 |
                     (uint6)QVar19 & 0xffff00000000 | (uint6)(ushort)local_748.d));
        }
        if ((uVar13 != 0 && uVar29 != 0) && uVar13 != uVar33) {
          uiLanguages::anon_class_56_6_d83b7451::operator()
                    ((anon_class_56_6_d83b7451 *)local_6e8,
                     (QLocaleId)
                     (CONCAT24(uVar13,QVar19._0_4_) & 0xffffffff0000 | (uint6)(ushort)local_748.d));
        }
        if ((uVar13 != 0) && ((uVar12 != uVar29 && uVar12 != 0) && uVar13 != uVar33)) {
          uiLanguages::anon_class_56_6_d83b7451::operator()
                    ((anon_class_56_6_d83b7451 *)local_6e8,
                     (QLocaleId)((uint6)local_748.d._4_4_ << 0x20 | (uint6)(uint)local_748.d));
        }
        if (pQStack_6d0 != (QArrayDataPointer<QString> *)0x0) {
          LOCK();
          *(int *)&pQStack_6d0->d = *(int *)&pQStack_6d0->d + -1;
          UNLOCK();
          if (*(int *)&pQStack_6d0->d == 0) {
            QArrayData::deallocate((QArrayData *)pQStack_6d0,1,0x10);
          }
        }
        if ((QArrayDataPointer<QString> *)local_58 != (QArrayDataPointer<QString> *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)&((PrivateShared *)local_58)->ref)->_q_value).
          super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)&((PrivateShared *)local_58)->ref)->_q_value).
               super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)&((PrivateShared *)local_58)->ref)->_q_value).
              super___atomic_base<int>._M_i == 0) {
            qVar31 = 1;
            uVar32 = local_58;
LAB_0031b268:
            QArrayData::deallocate((QArrayData *)uVar32,qVar31,0x10);
          }
        }
      }
      lVar34 = lVar34 + -6;
      bVar15 = 1 < (long)local_7d0;
      local_7d0 = (QArrayDataPointer<QString> *)((long)&local_7d0[-1].size + 7);
    } while (bVar15);
  }
  memcpy((QDuplicateTracker<QString,_32UL> *)local_6e8,&DAT_004f4400,0x688);
  QDuplicateTracker<QString,_32UL>::QDuplicateTracker
            ((QDuplicateTracker<QString,_32UL> *)local_6e8,(__return_storage_ptr__->d).size);
  psVar28 = extraout_RDX;
  if ((__return_storage_ptr__->d).size != 0) {
    lVar34 = 0;
    do {
      local_58 = (QArrayDataPointer<QString> *)(local_a8 + 8);
      pVar38 = std::
               _Hashtable<QString,QString,std::pmr::polymorphic_allocator<QString>,std::__detail::_Identity,std::equal_to<QString>,QDuplicateTracker<QString,32ul>::QHasher<QString>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
               ::
               _M_insert<QString_const&,std::__detail::_AllocNode<std::pmr::polymorphic_allocator<std::__detail::_Hash_node<QString,true>>>>
                         ((_Hashtable<QString,QString,std::pmr::polymorphic_allocator<QString>,std::__detail::_Identity,std::equal_to<QString>,QDuplicateTracker<QString,32ul>::QHasher<QString>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                           *)local_a8,(__return_storage_ptr__->d).ptr + lVar34,
                          (anon_union_24_3_e3d07ef4_for_data *)&local_58);
      psVar28 = pVar38._8_8_;
      if (((undefined1  [16])pVar38 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        pDVar6 = (__return_storage_ptr__->d).d;
        if ((pDVar6 == (Data *)0x0) ||
           (1 < (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
          QArrayDataPointer<QString>::reallocateAndGrow
                    (&__return_storage_ptr__->d,GrowsAtEnd,0,(QArrayDataPointer<QString> *)0x0);
        }
        QtPrivate::QMovableArrayOps<QString>::erase
                  ((QMovableArrayOps<QString> *)__return_storage_ptr__,
                   (__return_storage_ptr__->d).ptr + lVar34,1);
        psVar28 = extraout_RDX_00;
      }
      else {
        lVar34 = lVar34 + 1;
      }
    } while (lVar34 < (__return_storage_ptr__->d).size);
  }
  if ((__return_storage_ptr__->d).size != 0) {
    psVar21 = (storage_type_conflict *)0x0;
    local_7b0 = (storage_type_conflict *)0x0;
    psVar26 = (storage_type_conflict *)0x0;
    do {
      pQVar24 = (__return_storage_ptr__->d).ptr;
      data = (QArrayDataPointer<QString> *)pQVar24[(long)psVar26].d.d;
      pQVar7 = (QString *)pQVar24[(long)psVar26].d.ptr;
      pQVar8 = (QLocaleId *)pQVar24[(long)psVar26].d.size;
      if (data != (QArrayDataPointer<QString> *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)&data->d)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)&data->d)->_q_value).super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      name.m_data = psVar28;
      name.m_size = (qsizetype)pQVar7;
      QVar19 = QLocaleId::fromName(pQVar8,name);
      local_58._0_6_ = QVar19;
      QVar19 = QLocaleId::withLikelySubtagsAdded((QLocaleId *)&local_58);
      if ((long)psVar21 <= (long)psVar26) {
        lVar34 = (long)psVar26 * 0x18 + 0x28;
        psVar28 = psVar21;
        psVar21 = psVar26;
        while (psVar21 = (storage_type_conflict *)((long)psVar21 + 1), local_7b0 = psVar21,
              (long)psVar21 < (__return_storage_ptr__->d).size) {
          pQVar24 = (__return_storage_ptr__->d).ptr;
          name_00.m_data = psVar28;
          name_00.m_size = *(qsizetype *)((long)pQVar24 + lVar34 + -8);
          QVar20 = QLocaleId::fromName(*(QLocaleId **)((long)&(pQVar24->d).d + lVar34),name_00);
          local_58._0_6_ = QVar20;
          QVar20 = QLocaleId::withLikelySubtagsAdded((QLocaleId *)&local_58);
          if (((QVar20.language_id != QVar19.language_id) ||
              (((QVar20._0_4_ ^ QVar19._0_4_) & 0xffff0000) != 0)) ||
             (lVar34 = lVar34 + 0x18, psVar28 = psVar21, QVar20.territory_id != QVar19.territory_id)
             ) break;
        }
      }
      if (data != (QArrayDataPointer<QString> *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)&data->d)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)&data->d)->_q_value).super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      needle.m_data = L"C";
      needle.m_size = 1;
      haystack_01.m_data = (storage_type_conflict *)pQVar7;
      haystack_01.m_size = (qsizetype)pQVar8;
      bVar15 = QtPrivate::startsWith(haystack_01,needle,CaseSensitive);
      ch.ucs._1_1_ = 0;
      ch.ucs._0_1_ = separator;
      if (bVar15) {
        bVar15 = true;
        if (pQVar8 != (QLocaleId *)0x1) {
          bVar15 = *(char16_t *)((long)&(pQVar7->d).d + 2) == ch.ucs;
        }
      }
      else {
        bVar15 = false;
      }
      bVar16 = true;
      psVar28 = extraout_RDX_01;
      if (!bVar15) {
        if (data != (QArrayDataPointer<QString> *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)&data->d)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)&data->d)->_q_value).super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        needle_00.m_data = L"und";
        needle_00.m_size = 3;
        haystack_02.m_data = (storage_type_conflict *)pQVar7;
        haystack_02.m_size = (qsizetype)pQVar8;
        bVar16 = QtPrivate::startsWith(haystack_02,needle_00,CaseSensitive);
        psVar28 = extraout_RDX_02;
        local_7a8 = data;
        if (bVar16) {
          bVar16 = true;
          if (pQVar8 != (QLocaleId *)0x3) {
            bVar16 = *(char16_t *)((long)&(pQVar7->d).d + 6) == ch.ucs;
          }
        }
        else {
          bVar16 = false;
        }
      }
      if (!bVar15 && local_7a8 != (QArrayDataPointer<QString> *)0x0) {
        LOCK();
        *(int *)&local_7a8->d = *(int *)&local_7a8->d + -1;
        UNLOCK();
        if (*(int *)&local_7a8->d == 0) {
          QArrayData::deallocate((QArrayData *)local_7a8,2,0x10);
          psVar28 = extraout_RDX_03;
        }
      }
      if (data != (QArrayDataPointer<QString> *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)&data->d)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)&data->d)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)&data->d)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)data,2,0x10);
          psVar28 = extraout_RDX_04;
        }
      }
      if (!bVar16) {
        local_798 = (__return_storage_ptr__->d).size;
        local_58 = data;
        uStack_50 = pQVar7;
        local_48 = pQVar8;
        if (data != (QArrayDataPointer<QString> *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)&data->d)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)&data->d)->_q_value).super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        do {
          qVar31 = QString::lastIndexOf((QString *)&local_58,ch,-1,CaseSensitive);
          psVar28 = extraout_RDX_05;
          if (qVar31 < 1) break;
          QString::QString((QString *)&local_708,(QChar *)uStack_50,qVar31);
          uVar14 = uStack_50;
          uVar32 = local_58;
          qVar31 = local_708.size;
          pDVar6 = local_708.d;
          local_708.d = (Data *)local_58;
          local_58 = pDVar6;
          uStack_50 = local_708.ptr;
          local_708.ptr = (QString *)uVar14;
          local_708.size = local_48;
          local_48 = qVar31;
          if ((QArrayDataPointer<QString> *)uVar32 != (QArrayDataPointer<QString> *)0x0) {
            LOCK();
            (((PrivateShared *)uVar32)->ref).super_QAtomicInteger<int>.
            super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
                 (((PrivateShared *)uVar32)->ref).super_QAtomicInteger<int>.
                 super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((PrivateShared *)uVar32)->ref).super_QAtomicInteger<int>.
                super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate((QArrayData *)uVar32,2,0x10);
            }
          }
          cVar22 = std::
                   _Hashtable<QString,_QString,_std::pmr::polymorphic_allocator<QString>,_std::__detail::_Identity,_std::equal_to<QString>,_QDuplicateTracker<QString,_32UL>::QHasher<QString>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   ::find((_Hashtable<QString,_QString,_std::pmr::polymorphic_allocator<QString>,_std::__detail::_Identity,_std::equal_to<QString>,_QDuplicateTracker<QString,_32UL>::QHasher<QString>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                           *)local_a8,(key_type *)&local_58);
          name_01.m_data = extraout_RDX_06;
          name_01.m_size = uStack_50;
          QVar20 = QLocaleId::fromName((QLocaleId *)local_48,name_01);
          local_708.d = (Data *)CONCAT26(local_708.d._6_2_,QVar20);
          QVar20 = QLocaleId::withLikelySubtagsAdded((QLocaleId *)&local_708);
          uVar18 = QVar20._0_4_ ^ QVar19._0_4_;
          bVar16 = (uVar18 & 0xffff0000) == 0;
          bVar15 = cVar22.super__Node_iterator_base<QString,_true>._M_cur != (__node_type *)0x0;
          psVar28 = extraout_RDX_07;
          if ((!bVar15) && ((long)local_7b0 < local_798)) {
            bVar37 = (uVar18 & 0xffff0000) == 0;
            bVar15 = false;
            local_788 = (long)local_7b0 * 0x18 + 0x28;
            psVar35 = local_7b0;
            bVar16 = bVar37;
            do {
              pQVar24 = (__return_storage_ptr__->d).ptr;
              local_708.d = (Data *)pQVar24[(long)psVar35].d.d;
              local_708.ptr = (QString *)pQVar24[(long)psVar35].d.ptr;
              local_708.size = pQVar24[(long)psVar35].d.size;
              if ((QArrayDataPointer<QString> *)local_708.d != (QArrayDataPointer<QString> *)0x0) {
                LOCK();
                *(int *)&((QArrayDataPointer<QString> *)local_708.d)->d =
                     *(int *)&((QArrayDataPointer<QString> *)local_708.d)->d + 1;
                UNLOCK();
              }
              bVar17 = QString::startsWith((QString *)&local_708,(QString *)&local_58,CaseSensitive)
              ;
              uVar32 = local_48;
              pQVar24 = local_708.ptr;
              if (bVar17) {
                psVar28 = extraout_RDX_08;
                if (*(char16_t *)((long)&((local_708.ptr)->d).d + local_48 * 2) == ch.ucs) {
                  haystack.m_data = (storage_type_conflict *)0xffffffffffffffff;
                  haystack.m_size = (qsizetype)local_708.ptr;
                  this_00 = (QtPrivate *)
                            QtPrivate::lastIndexOf
                                      ((QtPrivate *)local_708.size,haystack,(ulong)(uint)separator,
                                       L'\x01',(CaseSensitivity)in_R9);
                  psVar28 = extraout_RDX_09;
                  bVar16 = false;
                  bVar37 = false;
                  if (((long)uVar32 < (long)this_00) && (bVar16 = false, bVar37 = false, !bVar15)) {
                    lVar34 = (__return_storage_ptr__->d).size;
                    plVar23 = (long *)((long)&(((__return_storage_ptr__->d).ptr)->d).d + local_788);
                    plVar10 = plVar23;
                    psVar11 = psVar35;
joined_r0x0031b858:
                    do {
                      if ((long)psVar11 + 1 < lVar34) {
                        if (((QtPrivate *)*plVar10 != this_00) ||
                           (rhs_00.m_data = (storage_type_conflict *)pQVar24,
                           rhs_00.m_size = (qsizetype)this_00,
                           lhs_00.m_data = (storage_type_conflict *)plVar10[-1],
                           lhs_00.m_size = (qsizetype)*plVar10,
                           bVar16 = QtPrivate::equalStrings(lhs_00,rhs_00), !bVar16)) {
                          plVar10 = plVar10 + 3;
                          psVar11 = (storage_type_conflict *)((long)psVar11 + 1);
                          goto joined_r0x0031b858;
                        }
                      }
                      else {
                        bVar15 = true;
                      }
                      haystack_00.m_data = (storage_type_conflict *)0xffffffffffffffff;
                      haystack_00.m_size = (qsizetype)pQVar24;
                      this_00 = (QtPrivate *)
                                QtPrivate::lastIndexOf
                                          (this_00,haystack_00,(ulong)(uint)separator,L'\x01',
                                           (CaseSensitivity)in_R9);
                      bVar37 = false;
                      bVar16 = false;
                      psVar28 = extraout_RDX_10;
                      if (((long)this_00 <= (long)uVar32) ||
                         (plVar10 = plVar23, psVar11 = psVar35, bVar15)) break;
                    } while( true );
                  }
                }
              }
              else {
                local_748.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                local_748.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                local_748.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
                pQVar24 = QString::replace((QString *)&local_708,ch,(QChar)0x2d,CaseSensitive);
                name_02.m_data = extraout_RDX_11;
                name_02.m_size = (qsizetype)(pQVar24->d).ptr;
                QVar20 = QLocaleId::fromName((QLocaleId *)(pQVar24->d).size,name_02);
                local_758._0_4_ = QVar20._0_4_;
                local_758.territory_id = QVar20.territory_id;
                QVar20 = QLocaleId::withLikelySubtagsAdded(&local_758);
                local_750._0_4_ = QVar20._0_4_;
                local_750.territory_id = QVar20.territory_id;
                QLocaleId::name((QByteArray *)&local_748,&local_750,separator);
                uVar32 = local_48;
                qVar31 = local_748.size;
                pQVar24 = local_748.ptr;
                needle_01.m_data = (storage_type_conflict *)uStack_50;
                needle_01.m_size = local_48;
                haystack_03.m_data = (char *)local_748.ptr;
                haystack_03.m_size = local_748.size;
                bVar17 = QtPrivate::startsWith(haystack_03,needle_01,CaseSensitive);
                if (bVar17) {
                  if (qVar31 == uVar32) {
                    bVar37 = false;
                    bVar16 = false;
                  }
                  else {
                    bVar16 = bVar37;
                    if (*(TagSeparator *)((long)&(pQVar24->d).d + uVar32) == separator) {
                      bVar37 = false;
                      bVar16 = false;
                    }
                  }
                }
                psVar28 = extraout_RDX_12;
                if (&(local_748.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_748.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_748.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                       + -1;
                  UNLOCK();
                  if (((local_748.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                      == 0) {
                    QArrayData::deallocate(&(local_748.d)->super_QArrayData,1,0x10);
                    psVar28 = extraout_RDX_13;
                  }
                }
              }
              if ((QArrayDataPointer<QString> *)local_708.d != (QArrayDataPointer<QString> *)0x0) {
                LOCK();
                *(int *)&(local_708.d)->super_QArrayData =
                     *(int *)&(local_708.d)->super_QArrayData + -1;
                UNLOCK();
                if (*(int *)&(local_708.d)->super_QArrayData == 0) {
                  QArrayData::deallocate(&(local_708.d)->super_QArrayData,2,0x10);
                  psVar28 = extraout_RDX_14;
                }
              }
              if (bVar15) break;
              psVar35 = (storage_type_conflict *)((long)psVar35 + 1);
              local_788 = local_788 + 0x18;
            } while ((long)psVar35 < local_798);
          }
          if (!bVar15) {
            local_708.d = (Data *)(local_a8 + 8);
            std::
            _Hashtable<QString,QString,std::pmr::polymorphic_allocator<QString>,std::__detail::_Identity,std::equal_to<QString>,QDuplicateTracker<QString,32ul>::QHasher<QString>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
            ::
            _M_insert<QString_const&,std::__detail::_AllocNode<std::pmr::polymorphic_allocator<std::__detail::_Hash_node<QString,true>>>>
                      ((_Hashtable<QString,QString,std::pmr::polymorphic_allocator<QString>,std::__detail::_Identity,std::equal_to<QString>,QDuplicateTracker<QString,32ul>::QHasher<QString>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                        *)local_a8,(anon_union_24_3_e3d07ef4_for_data *)&local_58,&local_708);
            if (bVar16) {
              QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                        ((QMovableArrayOps<QString> *)__return_storage_ptr__,(qsizetype)local_7b0,
                         (QString *)&local_58);
              QList<QString>::begin(__return_storage_ptr__);
              local_7b0 = (storage_type_conflict *)((long)local_7b0 + 1);
              local_798 = local_798 + 1;
              psVar28 = extraout_RDX_15;
            }
            else {
              QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                        ((QMovableArrayOps<QString> *)__return_storage_ptr__,
                         (__return_storage_ptr__->d).size,(QString *)&local_58);
              QList<QString>::end(__return_storage_ptr__);
              psVar28 = extraout_RDX_16;
            }
          }
        } while (!bVar15);
        uVar32 = local_58;
        if ((QArrayDataPointer<QString> *)local_58 != (QArrayDataPointer<QString> *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)&((PrivateShared *)local_58)->ref)->_q_value).
          super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)&((PrivateShared *)local_58)->ref)->_q_value).
               super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)&((PrivateShared *)uVar32)->ref)->_q_value).
              super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_58,2,0x10);
            psVar28 = extraout_RDX_17;
          }
        }
      }
      if (data != (QArrayDataPointer<QString> *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)&data->d)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)&data->d)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)&data->d)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)data,2,0x10);
          psVar28 = extraout_RDX_18;
        }
      }
      psVar26 = (storage_type_conflict *)((long)psVar26 + 1);
      if ((long)psVar21 <= (long)psVar26) {
        psVar26 = local_7b0;
      }
    } while ((long)psVar26 < (__return_storage_ptr__->d).size);
  }
  std::
  _Hashtable<QString,_QString,_std::pmr::polymorphic_allocator<QString>,_std::__detail::_Identity,_std::equal_to<QString>,_QDuplicateTracker<QString,_32UL>::QHasher<QString>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<QString,_QString,_std::pmr::polymorphic_allocator<QString>,_std::__detail::_Identity,_std::equal_to<QString>,_QDuplicateTracker<QString,_32UL>::QHasher<QString>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)local_a8);
  std::pmr::monotonic_buffer_resource::~monotonic_buffer_resource(local_e8);
  if (&(local_728.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_728.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_728.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_728.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_728.d.d)->super_QArrayData,6,0x10);
    }
  }
LAB_0031bb81:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QStringList QLocale::uiLanguages(TagSeparator separator) const
{
    const char sep = char(separator);
    QStringList uiLanguages;
    if (uchar(sep) > 0x7f) {
        badSeparatorWarning("uiLanguages", sep);
        return uiLanguages;
    }
    QList<QLocaleId> localeIds;
#ifdef QT_NO_SYSTEMLOCALE
    constexpr bool isSystem = false;
#else
    const bool isSystem = d->m_data == &systemLocaleData;
    if (isSystem) {
        uiLanguages = systemLocale()->query(QSystemLocale::UILanguages).toStringList();
        if (separator != TagSeparator::Dash) {
            // Map from default separator, Dash, used by backends:
            const QChar join = QLatin1Char(sep);
            uiLanguages = uiLanguages.replaceInStrings(u"-", QStringView(&join, 1));
        }
        // ... but we need to include likely-adjusted forms of each of those, too.
        // For now, collect up locale Ids representing the entries, for later processing:
        for (const auto &entry : std::as_const(uiLanguages))
            localeIds.append(QLocaleId::fromName(entry));
        if (localeIds.isEmpty())
            localeIds.append(systemLocale()->fallbackLocale().d->m_data->id());
        // If the system locale (isn't C and) didn't include itself in the list,
        // or as fallback, presume to know better than it and put its name
        // first. (Known issue, QTBUG-104930, on some macOS versions when in
        // locale en_DE.) Our translation system might have a translation for a
        // locale the platform doesn't believe in.
        const QString name = QString::fromLatin1(d->m_data->id().name(sep)); // Raw name
        if (!name.isEmpty() && language() != C && !uiLanguages.contains(name)) {
            // That uses contains(name) as a cheap pre-test, but there may be an
            // entry that matches this on purging likely subtags.
            const QLocaleId id = d->m_data->id();
            const QLocaleId mine = id.withLikelySubtagsRemoved();
            const auto isMine = [mine](const QString &entry) {
                return QLocaleId::fromName(entry).withLikelySubtagsRemoved() == mine;
            };
            if (std::none_of(uiLanguages.constBegin(), uiLanguages.constEnd(), isMine)) {
                localeIds.prepend(id);
                uiLanguages.prepend(QString::fromLatin1(id.name(sep)));
            }
        }
    } else
#endif
    {
        localeIds.append(d->m_data->id());
    }

    for (qsizetype i = localeIds.size(); i-- > 0; ) {
        const QLocaleId id = localeIds.at(i);
        Q_ASSERT(id.language_id);
        if (id.language_id == C) {
            if (!uiLanguages.contains(u"C"_s))
                uiLanguages.append(u"C"_s);
            // Attempt no likely sub-tag amendments to C.
            continue;
        }

        qsizetype j;
        const QByteArray prior = id.name(sep);
        bool faithful = true; // prior matches uiLanguages.at(j - 1)
        if (isSystem && i < uiLanguages.size()) {
            // Adding likely-adjusted forms to system locale's list.
            faithful = uiLanguages.at(i) == QLatin1StringView(prior);
            Q_ASSERT(faithful
                     // A legacy code may get mapped to an ID with a different name:
                     || QLocaleId::fromName(uiLanguages.at(i)).name(sep) == prior);
            // Insert just after the entry we're supplementing:
            j = i + 1;
        } else {
            // Plain locale or empty system uiLanguages; just append.
            if (!uiLanguages.contains(QLatin1StringView(prior)))
                uiLanguages.append(QString::fromLatin1(prior));
            j = uiLanguages.size();
        }

        const QLocaleId max = id.withLikelySubtagsAdded();
        Q_ASSERT(max.language_id);
        Q_ASSERT(max.language_id == id.language_id);
        // We can't say the same for script or territory, though.

        // We have various candidates to consider.
        const auto addIfEquivalent = [&j, &uiLanguages, max, sep, prior, faithful](QLocaleId cid) {
            if (cid.withLikelySubtagsAdded() == max) {
                if (const QByteArray name = cid.name(sep); name != prior)
                    uiLanguages.insert(j, QString::fromLatin1(name));
                else if (faithful) // Later candidates are more specific, so go before.
                    --j;
            }
        };
        // language
        addIfEquivalent({ max.language_id, 0, 0 });
        // language-script
        if (max.script_id)
            addIfEquivalent({ max.language_id, max.script_id, 0 });
        if (id.script_id && id.script_id != max.script_id)
            addIfEquivalent({ id.language_id, id.script_id, 0 });
        // language-territory
        if (max.territory_id)
            addIfEquivalent({ max.language_id, 0, max.territory_id });
        if (id.territory_id && id.territory_id != max.territory_id)
            addIfEquivalent({ id.language_id, 0, id.territory_id });
        // full
        if (max.territory_id && max.script_id)
            addIfEquivalent(max);
        if (max.territory_id && id.script_id && id.script_id != max.script_id)
            addIfEquivalent({ id.language_id, id.script_id, max.territory_id });
        if (max.script_id && id.territory_id && id.territory_id != max.territory_id)
            addIfEquivalent({ id.language_id, max.script_id, id.territory_id });
        if (id.territory_id && id.territory_id != max.territory_id
            && id.script_id && id.script_id != max.script_id) {
            addIfEquivalent(id);
        }
    }

    // Second pass: deduplicate.
    QDuplicateTracker<QString> known(uiLanguages.size());
    for (qsizetype i = 0; i < uiLanguages.size();) {
        if (known.hasSeen(uiLanguages.at(i)))
            uiLanguages.remove(i);
        else
            ++i;
    }

    // Third pass: add truncations, when not already present.
    // Cubic in list length, but hopefully that's at most a dozen or so.
    const QLatin1Char cut(sep);
    const auto hasPrefix = [cut](auto name, QStringView stem) {
        // A prefix only counts if it's either full or followed by a separator.
        return name.startsWith(stem)
            && (name.size() == stem.size() || name.at(stem.size()) == cut);
    };
    // As we now forward-traverse the list, we need to keep track of the
    // positions just after (a) the block of things added above that are
    // equivalent to the current entry and (b) the block of truncations (if any)
    // added just after this block. All truncations of entries in (a) belong at
    // the end of (b); once i advances to the end of (a) it must jump to just
    // after (b). The more specific entries in (a) may well have truncations
    // that can also arise from less specific ones later in (a); for the
    // purposes of determining whether such truncations go at the end of (b) or
    // the end of the list, we thus need to ignore these matches.
    qsizetype afterEquivs = 0;
    qsizetype afterTruncs = 0;
    // From here onwards, we only have the truncations we're adding, whose
    // truncations should all have been included already.
    // If advancing i brings us to the end of block (a), jump to the end of (b):
    for (qsizetype i = 0; i < uiLanguages.size(); ++i >= afterEquivs && (i = afterTruncs)) {
        const QString entry = uiLanguages.at(i);
        const QLocaleId max = QLocaleId::fromName(entry).withLikelySubtagsAdded();
        // Keep track of our two blocks:
        if (i >= afterEquivs) {
            Q_ASSERT(i >= afterTruncs); // i.e. we just skipped past the end of a block
            afterEquivs = i + 1;
            // Advance past equivalents of entry:
            while (afterEquivs < uiLanguages.size()
                   && QLocaleId::fromName(uiLanguages.at(afterEquivs))
                           .withLikelySubtagsAdded() == max) {
                ++afterEquivs;
            }
            // We'll add any truncations starting there:
            afterTruncs = afterEquivs;
        }
        if (hasPrefix(entry, u"C") || hasPrefix(entry, u"und"))
            continue;
        qsizetype stopAt = uiLanguages.size();
        QString prefix = entry;
        qsizetype at = 0;
        while ((at = prefix.lastIndexOf(cut)) > 0) {
            prefix = prefix.first(at);
            // Don't test with hasSeen() as we might defer adding to later, when
            // we'll need known to see the later entry's offering of this prefix
            // as a new entry.
            bool found = known.contains(prefix);
            /* By default we append but if no later entry has this as a prefix
               and the locale it implies would use the same script as entry, put
               it after the block of consecutive equivalents of which entry is a
               part instead. Thus [en-NL, nl-NL, en-GB] will append en but
               [en-NL, en-GB, nl-NL] will put it before nl-NL, for example. We
               require a script match so we don't pick translations that the
               user cannot read, despite knowing the language. (Ideally that
               would be a constraint the caller can opt into / out of. See
               QTBUG-112765.)
            */
            bool justAfter
                = (QLocaleId::fromName(prefix).withLikelySubtagsAdded().script_id == max.script_id);
            for (qsizetype j = afterTruncs; !found && j < stopAt; ++j) {
                QString later = uiLanguages.at(j);
                if (!later.startsWith(prefix)) {
                    const QByteArray laterFull =
                        QLocaleId::fromName(later.replace(cut, u'-')
                            ).withLikelySubtagsAdded().name(sep);
                    // When prefix matches a later entry's max, it belongs later.
                    if (hasPrefix(QLatin1StringView(laterFull), prefix))
                        justAfter = false;
                    continue;
                }
                // The duplicate tracker would already have spotted if equal:
                Q_ASSERT(later.size() > prefix.size());
                if (later.at(prefix.size()) == cut) {
                    justAfter = false;
                    // Prefix match. Shall produce the same prefix, but possibly
                    // after prefixes of other entries in the list. If later has
                    // a longer prefix not yet in the list, we want that before
                    // this shorter prefix, so leave this for later, otherwise,
                    // we include this prefix right away.
                    QStringView head{later};
                    for (qsizetype as = head.lastIndexOf(cut);
                         !found && as > prefix.size(); as = head.lastIndexOf(cut)) {
                        head = head.first(as);
                        bool seen = false;
                        for (qsizetype k = j + 1; !seen && k < uiLanguages.size(); ++k)
                            seen = uiLanguages.at(k) == head;
                        if (!seen)
                            found = true;
                    }
                }
            }
            if (found) // Don't duplicate.
                break; // any further truncations of prefix would also be found.
            // Now we're committed to adding it, get it into known:
            (void) known.hasSeen(prefix);
            if (justAfter) {
                uiLanguages.insert(afterTruncs++, prefix);
                ++stopAt; // All later entries have moved one step later.
            } else {
                uiLanguages.append(prefix);
            }
        }
    }

    return uiLanguages;
}